

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O0

int CfdSetIssueAsset(void *handle,void *create_handle,char *txid,uint32_t vout,char *contract_hash,
                    int64_t asset_amount,char *asset_address,char *asset_locking_script,
                    int64_t token_amount,char *token_address,char *token_locking_script,
                    bool is_blind_asset,char **entropy,char **asset_string,char **token_string)

{
  bool bVar1;
  undefined8 uVar2;
  uint32_t in_ECX;
  uint uVar3;
  char *in_RDX;
  long in_RSI;
  char *in_R8;
  int64_t in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  long in_stack_00000018;
  long in_stack_00000020;
  long in_stack_00000028;
  byte in_stack_00000030;
  undefined8 *in_stack_00000038;
  undefined8 *in_stack_00000040;
  undefined8 *in_stack_00000048;
  CfdException *except;
  exception *std_except;
  IssuanceParameter data;
  ByteData256 contract_hash_obj;
  IssuanceOutputParameter token_data;
  IssuanceOutputParameter issuance_data;
  OutPoint outpoint;
  ConfidentialTransactionContext *tx;
  bool is_bitcoin;
  CfdCapiTransactionData *tx_data;
  char *work_token;
  char *work_asset;
  char *work_entropy;
  int result;
  IssuanceOutputParameter *in_stack_fffffffffffff068;
  undefined4 in_stack_fffffffffffff070;
  undefined4 in_stack_fffffffffffff074;
  string *in_stack_fffffffffffff080;
  CfdError in_stack_fffffffffffff08c;
  IssuanceOutputParameter *in_stack_fffffffffffff090;
  bool *in_stack_fffffffffffff0c8;
  allocator *paVar4;
  string *in_stack_fffffffffffff0d0;
  undefined8 in_stack_fffffffffffff0e0;
  undefined1 is_blind;
  Amount *in_stack_fffffffffffff0e8;
  IssuanceOutputParameter *in_stack_fffffffffffff0f0;
  Amount *in_stack_fffffffffffff0f8;
  OutPoint *in_stack_fffffffffffff100;
  ConfidentialTransactionContext *in_stack_fffffffffffff108;
  IssuanceOutputParameter *in_stack_fffffffffffff120;
  ByteData256 *in_stack_fffffffffffff130;
  string local_e90 [8];
  string *in_stack_fffffffffffff178;
  undefined8 in_stack_fffffffffffff180;
  string local_e70;
  string local_e50;
  BlindFactor local_e30;
  ConfidentialAssetId local_e10;
  ConfidentialAssetId local_de8;
  allocator local_db9;
  string local_db8;
  ByteData256 local_d98;
  ByteData256 local_d80;
  Amount local_d68 [60];
  char *in_stack_fffffffffffff660;
  char *in_stack_fffffffffffff668;
  Amount local_668 [55];
  int64_t local_2f8;
  undefined1 local_2f0;
  allocator local_2d9;
  string local_2d8;
  Txid local_2b8;
  OutPoint local_298;
  undefined8 local_270;
  undefined1 local_262;
  allocator local_261;
  string local_260 [38];
  undefined1 local_23a;
  allocator local_239;
  string local_238 [37];
  byte local_213;
  undefined1 local_212;
  allocator local_211;
  string local_210 [32];
  CfdSourceLocation local_1f0;
  undefined1 local_1d2;
  allocator local_1d1;
  string local_1d0 [32];
  CfdSourceLocation local_1b0;
  undefined1 local_192;
  allocator local_191;
  string local_190 [32];
  CfdSourceLocation local_170;
  undefined1 local_152;
  allocator local_151;
  string local_150 [32];
  CfdSourceLocation local_130;
  undefined1 local_112;
  allocator local_111;
  string local_110 [32];
  CfdSourceLocation local_f0;
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [32];
  CfdSourceLocation local_b0;
  long local_98;
  allocator local_89;
  string local_88 [48];
  char *local_58;
  char *local_50;
  char *local_48;
  undefined4 local_40;
  byte local_39;
  int64_t local_38;
  char *local_30;
  uint32_t local_24;
  char *local_20;
  long local_18;
  int local_4;
  
  is_blind = (undefined1)((ulong)in_stack_fffffffffffff0e0 >> 0x38);
  local_39 = in_stack_00000030 & 1;
  local_40 = 0xffffffff;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_58 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  cfd::Initialize();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"TransactionData",&local_89);
  cfd::capi::CheckBuffer((void *)in_stack_fffffffffffff180,in_stack_fffffffffffff178);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  local_98 = local_18;
  if (in_stack_00000038 == (undefined8 *)0x0) {
    local_b0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_b0.filename = local_b0.filename + 1;
    local_b0.line = 0xac7;
    local_b0.funcname = "CfdSetIssueAsset";
    cfd::core::logger::warn<>(&local_b0,"entropy is null.");
    local_d2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"Failed to parameter. entropy is null.",&local_d1);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffff090,in_stack_fffffffffffff08c,
               in_stack_fffffffffffff080);
    local_d2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (local_20 == (char *)0x0) {
    local_f0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_f0.filename = local_f0.filename + 1;
    local_f0.line = 0xacd;
    local_f0.funcname = "CfdSetIssueAsset";
    cfd::core::logger::warn<>(&local_f0,"txid is null.");
    local_112 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"Failed to parameter. txid is null.",&local_111);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffff090,in_stack_fffffffffffff08c,
               in_stack_fffffffffffff080);
    local_112 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (in_stack_00000040 == (undefined8 *)0x0) {
    local_130.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_130.filename = local_130.filename + 1;
    local_130.line = 0xad3;
    local_130.funcname = "CfdSetIssueAsset";
    cfd::core::logger::warn<>(&local_130,"asset_string is null.");
    local_152 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_150,"Failed to parameter. asset_string is null.",&local_151);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffff090,in_stack_fffffffffffff08c,
               in_stack_fffffffffffff080);
    local_152 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((0 < in_stack_00000018) && (in_stack_00000048 == (undefined8 *)0x0)) {
    local_170.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_170.filename = local_170.filename + 1;
    local_170.line = 0xad9;
    local_170.funcname = "CfdSetIssueAsset";
    cfd::core::logger::warn<>(&local_170,"token_string is null.");
    local_192 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_190,"Failed to parameter. token_string is null.",&local_191);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffff090,in_stack_fffffffffffff08c,
               in_stack_fffffffffffff080);
    local_192 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((in_stack_00000008 == 0) && (in_stack_00000010 == 0)) {
    local_1b0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_1b0.filename = local_1b0.filename + 1;
    local_1b0.line = 0xadf;
    local_1b0.funcname = "CfdSetIssueAsset";
    cfd::core::logger::warn<>(&local_1b0,"asset address and script is null.");
    local_1d2 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_1d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1d0,"Failed to parameter. asset address and script is null.",paVar4);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffff090,in_stack_fffffffffffff08c,
               in_stack_fffffffffffff080);
    local_1d2 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (((0 < in_stack_00000018) && (in_stack_00000020 == 0)) && (in_stack_00000028 == 0)) {
    local_1f0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
                 ,0x2f);
    local_1f0.filename = local_1f0.filename + 1;
    local_1f0.line = 0xae6;
    local_1f0.funcname = "CfdSetIssueAsset";
    cfd::core::logger::warn<>(&local_1f0,"token address and script is null.");
    local_212 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_211;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_210,"Failed to parameter. token address and script is null.",paVar4);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffff090,in_stack_fffffffffffff08c,
               in_stack_fffffffffffff080);
    local_212 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_213 = 0;
  cfd::capi::ConvertNetType
            ((int)((ulong)in_stack_fffffffffffff0d0 >> 0x20),in_stack_fffffffffffff0c8);
  if (*(long *)(local_98 + 0x18) == 0) {
    local_23a = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_239;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_238,"Invalid handle state. tx is null",paVar4);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffff090,in_stack_fffffffffffff08c,
               in_stack_fffffffffffff080);
    local_23a = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_213 & 1) != 0) {
    local_262 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_260,"Invalid handle state. tx is bitcoin.",&local_261);
    cfd::core::CfdException::CfdException
              ((CfdException *)in_stack_fffffffffffff090,in_stack_fffffffffffff08c,
               in_stack_fffffffffffff080);
    local_262 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_270 = *(undefined8 *)(local_98 + 0x18);
  paVar4 = &local_2d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d8,local_20,paVar4);
  cfd::core::Txid::Txid(&local_2b8,&local_2d8);
  cfd::core::OutPoint::OutPoint(&local_298,&local_2b8,local_24);
  cfd::core::Txid::~Txid((Txid *)0x5bfe9d);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d9);
  cfd::capi::ConvertToIssuanceParameter(in_stack_fffffffffffff668,in_stack_fffffffffffff660);
  cfd::core::Amount::Amount(local_668,local_38);
  local_2f0 = local_668[0].ignore_check_;
  local_2f8 = local_668[0].amount_;
  cfd::IssuanceOutputParameter::IssuanceOutputParameter(in_stack_fffffffffffff090);
  if (0 < in_stack_00000018) {
    cfd::capi::ConvertToIssuanceParameter(in_stack_fffffffffffff668,in_stack_fffffffffffff660);
    cfd::IssuanceOutputParameter::operator=
              ((IssuanceOutputParameter *)
               CONCAT44(in_stack_fffffffffffff074,in_stack_fffffffffffff070),
               in_stack_fffffffffffff068);
    cfd::IssuanceOutputParameter::~IssuanceOutputParameter
              ((IssuanceOutputParameter *)
               CONCAT44(in_stack_fffffffffffff074,in_stack_fffffffffffff070));
    cfd::core::Amount::Amount(local_d68,in_stack_00000018);
  }
  cfd::core::ByteData256::ByteData256(&local_d80);
  bVar1 = cfd::capi::IsEmptyString(local_30);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_db8,local_30,&local_db9);
    cfd::core::ByteData256::ByteData256(&local_d98,&local_db8);
    cfd::core::ByteData256::operator=(&local_d80,&local_d98);
    cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5c0124);
    std::__cxx11::string::~string((string *)&local_db8);
    std::allocator<char>::~allocator((allocator<char> *)&local_db9);
  }
  uVar3 = local_39 & 1;
  cfd::ConfidentialTransactionContext::SetAssetIssuance
            (in_stack_fffffffffffff108,in_stack_fffffffffffff100,in_stack_fffffffffffff0f8,
             in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8,in_stack_fffffffffffff120,
             (bool)is_blind,in_stack_fffffffffffff130);
  cfd::core::BlindFactor::GetHex_abi_cxx11_(&local_e50,&local_e30);
  local_48 = cfd::capi::CreateString(in_stack_fffffffffffff0d0);
  std::__cxx11::string::~string((string *)&local_e50);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_e70,&local_e10);
  local_50 = cfd::capi::CreateString(in_stack_fffffffffffff0d0);
  std::__cxx11::string::~string((string *)&local_e70);
  if (in_stack_00000048 != (undefined8 *)0x0) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_e90,&local_de8);
    local_58 = cfd::capi::CreateString(in_stack_fffffffffffff0d0);
    std::__cxx11::string::~string(local_e90);
  }
  *in_stack_00000038 = local_48;
  *in_stack_00000040 = local_50;
  if (in_stack_00000048 != (undefined8 *)0x0) {
    *in_stack_00000048 = local_58;
  }
  local_4 = 0;
  cfd::core::IssuanceParameter::~IssuanceParameter
            ((IssuanceParameter *)CONCAT44(in_stack_fffffffffffff074,uVar3));
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5c03d8);
  cfd::IssuanceOutputParameter::~IssuanceOutputParameter
            ((IssuanceOutputParameter *)CONCAT44(in_stack_fffffffffffff074,uVar3));
  cfd::IssuanceOutputParameter::~IssuanceOutputParameter
            ((IssuanceOutputParameter *)CONCAT44(in_stack_fffffffffffff074,uVar3));
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x5c03ff);
  return local_4;
}

Assistant:

int CfdSetIssueAsset(
    void* handle, void* create_handle, const char* txid, uint32_t vout,
    const char* contract_hash, int64_t asset_amount, const char* asset_address,
    const char* asset_locking_script, int64_t token_amount,
    const char* token_address, const char* token_locking_script,
    bool is_blind_asset, char** entropy, char** asset_string,
    char** token_string) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_entropy = nullptr;
  char* work_asset = nullptr;
  char* work_token = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (entropy == nullptr) {
      warn(CFD_LOG_SOURCE, "entropy is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. entropy is null.");
    }
    if (txid == nullptr) {
      warn(CFD_LOG_SOURCE, "txid is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null.");
    }
    if (asset_string == nullptr) {
      warn(CFD_LOG_SOURCE, "asset_string is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset_string is null.");
    }
    if ((token_amount > 0) && (token_string == nullptr)) {
      warn(CFD_LOG_SOURCE, "token_string is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. token_string is null.");
    }
    if ((asset_address == nullptr) && (asset_locking_script == nullptr)) {
      warn(CFD_LOG_SOURCE, "asset address and script is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset address and script is null.");
    }
    if ((token_amount > 0) && (token_address == nullptr) &&
        (token_locking_script == nullptr)) {
      warn(CFD_LOG_SOURCE, "token address and script is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. token address and script is null.");
    }
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    OutPoint outpoint(Txid(txid), vout);
    cfd::IssuanceOutputParameter issuance_data =
        ConvertToIssuanceParameter(asset_address, asset_locking_script);
    issuance_data.amount = Amount(asset_amount);
    cfd::IssuanceOutputParameter token_data;
    if (token_amount > 0) {
      token_data =
          ConvertToIssuanceParameter(token_address, token_locking_script);
      token_data.amount = Amount(token_amount);
    }
    ByteData256 contract_hash_obj;
    if (!IsEmptyString(contract_hash)) {
      contract_hash_obj = ByteData256(contract_hash);
    }

    auto data = tx->SetAssetIssuance(
        outpoint, issuance_data.amount, issuance_data, token_data.amount,
        token_data, is_blind_asset, contract_hash_obj);

    work_entropy = CreateString(data.entropy.GetHex());
    work_asset = CreateString(data.asset.GetHex());
    if (token_string != nullptr) {
      work_token = CreateString(data.token.GetHex());
    }

    *entropy = work_entropy;
    *asset_string = work_asset;
    if (token_string != nullptr) *token_string = work_token;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_entropy, &work_asset, &work_token);
  return result;
}